

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::SetRepeatedEnum
          (ExtensionSet *this,int number,int index,int value)

{
  anon_enum_32 *v1;
  anon_enum_32 *v2;
  LogMessage *pLVar1;
  CppType *v1_00;
  CppType *v2_00;
  undefined1 auVar2 [16];
  LogMessageFatal local_c8 [23];
  Voidify local_b1;
  CppType local_b0;
  CppType local_ac;
  string *local_a8;
  undefined1 local_a0 [16];
  LogMessageFatal local_90 [23];
  Voidify local_79;
  anon_enum_32 local_78;
  anon_enum_32 local_74;
  string *local_70;
  string *absl_log_internal_check_op_result;
  byte local_51;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  LogMessageFatal local_40 [23];
  Voidify local_29;
  Extension *local_28;
  Extension *extension;
  int local_18;
  int value_local;
  int index_local;
  int number_local;
  ExtensionSet *this_local;
  
  extension._4_4_ = value;
  local_18 = index;
  value_local = number;
  _index_local = this;
  local_28 = FindOrNull(this,number);
  local_51 = 0;
  if (local_28 == (Extension *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_50,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x21f,local_50._M_len,local_50._M_str);
    local_51 = 1;
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_40);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [38])"Index out-of-bounds (field is empty).");
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_29,pLVar1);
  }
  if ((local_51 & 1) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
  }
  local_74 = (anon_enum_32)((local_28->is_repeated & 1U) == 0);
  v1 = absl::lts_20240722::log_internal::
       GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_74);
  local_78 = REPEATED_FIELD;
  v2 = absl::lts_20240722::log_internal::
       GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_78);
  local_70 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                       (v1,v2,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                       );
  if (local_70 != (string *)0x0) {
    local_a0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_70);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x220,local_a0._0_8_,local_a0._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_90);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_79,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_90);
  }
  local_ac = anon_unknown_58::cpp_type(local_28->type);
  v1_00 = absl::lts_20240722::log_internal::
          GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_ac);
  local_b0 = CPPTYPE_ENUM;
  v2_00 = absl::lts_20240722::log_internal::
          GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_b0);
  local_a8 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                       (v1_00,v2_00,"cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
  if (local_a8 != (string *)0x0) {
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_a8);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_c8,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x220,auVar2._0_8_,auVar2._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_c8);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_b1,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_c8);
  }
  RepeatedField<int>::Set
            ((RepeatedField<int> *)local_28->field_0,local_18,(int *)((long)&extension + 4));
  return;
}

Assistant:

void ExtensionSet::SetRepeatedEnum(int number, int index, int value) {
  Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
  extension->ptr.repeated_enum_value->Set(index, value);
}